

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_namenode_client.cc
# Opt level: O1

Future<VoidResponse> * __thiscall
NarpcNamenodeClient::SetFile
          (Future<VoidResponse> *__return_storage_ptr__,NarpcNamenodeClient *this,
          FileInfo *file_info,bool close)

{
  int iVar1;
  shared_ptr<NarpcVoidResponse> response;
  shared_ptr<SetfileRequest> request;
  bool local_82;
  undefined1 local_81;
  NarpcVoidResponse *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  SetfileRequest *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  shared_ptr<AsyncTask<VoidResponse>_> local_60;
  shared_ptr<RpcMessage> local_50;
  shared_ptr<RpcMessage> local_40;
  RpcClient *local_30;
  
  local_70 = (SetfileRequest *)0x0;
  local_82 = close;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SetfileRequest,std::allocator<SetfileRequest>,FileInfo&,bool&>
            (&local_68,&local_70,(allocator<SetfileRequest> *)&local_80,file_info,&local_82);
  local_80 = (NarpcVoidResponse *)0x0;
  local_30 = &this->rpc_client_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<NarpcVoidResponse,std::allocator<NarpcVoidResponse>,RpcClient*>
            (&local_78,&local_80,(allocator<NarpcVoidResponse> *)&local_81,&local_30);
  local_40.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_70;
  local_40.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_68._M_pi;
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
    }
  }
  local_50.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_80;
  local_50.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_78._M_pi;
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
    }
  }
  iVar1 = RpcClient::IssueRequest(&this->rpc_client_,&local_40,&local_50);
  if (local_50.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_40.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (iVar1 < 0) {
    Future<VoidResponse>::Future(__return_storage_ptr__);
  }
  else {
    local_60.super___shared_ptr<AsyncTask<VoidResponse>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_80->super_AsyncTask<VoidResponse>;
    if (local_80 == (NarpcVoidResponse *)0x0) {
      local_60.super___shared_ptr<AsyncTask<VoidResponse>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (AsyncTask<VoidResponse> *)0x0;
    }
    local_60.super___shared_ptr<AsyncTask<VoidResponse>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_78._M_pi;
    if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
      }
    }
    Future<VoidResponse>::Future(__return_storage_ptr__,&local_60);
    if (local_60.super___shared_ptr<AsyncTask<VoidResponse>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<AsyncTask<VoidResponse>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
  }
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Future<VoidResponse> NarpcNamenodeClient::SetFile(FileInfo &file_info,
                                                  bool close) {
  shared_ptr<SetfileRequest> request =
      make_shared<SetfileRequest>(file_info, close);
  shared_ptr<NarpcVoidResponse> response =
      make_shared<NarpcVoidResponse>(&rpc_client_);

  if (rpc_client_.IssueRequest(request, response) < 0) {
    return Future<VoidResponse>::Failure();
  }
  return Future<VoidResponse>(response);
}